

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPoints.cpp
# Opt level: O1

int __thiscall
glcts::TessellationShaderPointsTests::init(TessellationShaderPointsTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParam;
  int extraout_EAX;
  TestCaseBase *pTVar1;
  
  pTVar1 = (TestCaseBase *)operator_new(0x2d8);
  extParam = &(this->super_TestCaseGroupBase).m_extParams;
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"point_rendering",
             "Verifies point size used to render points is taken from the right stage");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderPointsgl_PointSize_0214e788;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2d8);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"points_verification",
             "Verifies points generated by the tessellator unit do not duplicate and that their amount is correct"
            );
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderPointsVerification_0214e7c0;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void TessellationShaderPointsTests::init(void)
{
	addChild(new glcts::TessellationShaderPointsgl_PointSize(m_context, m_extParams));
	addChild(new glcts::TessellationShaderPointsVerification(m_context, m_extParams));
}